

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::GenerateCheckObjType(Lowerer *this,Instr *instrChkObjType)

{
  uint uVar1;
  uint uVar2;
  code *pcVar3;
  bool bVar4;
  uint sourceContextId;
  uint functionId;
  Opnd *pOVar5;
  SymOpnd *this_00;
  undefined4 *puVar6;
  PropertySymOpnd *this_01;
  PropertySym *pPVar7;
  char16 *pcVar8;
  JITTimeFunctionBody *this_02;
  char16 *pcVar9;
  char16 *pcVar10;
  LabelInstr *labelObjCheckFailed;
  LabelInstr *branchTarget;
  BranchInstr *instr_00;
  BailOutInfo *pBVar11;
  Instr *instr;
  LabelInstr *labelDone;
  LabelInstr *labelBailOut;
  uint inlineCacheIndex;
  PropertySym *propertySym;
  PropertySymOpnd *propertySymOpnd;
  Instr *instrChkObjType_local;
  Lowerer *this_local;
  
  pOVar5 = IR::Instr::GetSrc1(instrChkObjType);
  bVar4 = IR::Opnd::IsSymOpnd(pOVar5);
  if (bVar4) {
    pOVar5 = IR::Instr::GetSrc1(instrChkObjType);
    this_00 = IR::Opnd::AsSymOpnd(pOVar5);
    bVar4 = IR::SymOpnd::IsPropertySymOpnd(this_00);
    if (bVar4) goto LAB_0078b91a;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar6 = 1;
  bVar4 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                     ,0x191d,
                     "(instrChkObjType->GetSrc1()->IsSymOpnd() && instrChkObjType->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd())"
                     ,
                     "instrChkObjType->GetSrc1()->IsSymOpnd() && instrChkObjType->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd()"
                    );
  if (!bVar4) {
    pcVar3 = (code *)invalidInstructionException();
    (*pcVar3)();
  }
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar6 = 0;
LAB_0078b91a:
  pOVar5 = IR::Instr::GetSrc1(instrChkObjType);
  this_01 = IR::Opnd::AsPropertySymOpnd(pOVar5);
  bVar4 = IR::PropertySymOpnd::IsTypeCheckSeqCandidate(this_01);
  if ((!bVar4) || (bVar4 = IR::PropertySymOpnd::IsTypeChecked(this_01), bVar4)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1922,
                       "(propertySymOpnd->IsTypeCheckSeqCandidate() && !propertySymOpnd->IsTypeChecked())"
                       ,
                       "propertySymOpnd->IsTypeCheckSeqCandidate() && !propertySymOpnd->IsTypeChecked()"
                      );
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  bVar4 = IR::PropertySymOpnd::IsRootObjectNonConfigurableFieldLoad(this_01);
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1924,"(!propertySymOpnd->IsRootObjectNonConfigurableFieldLoad())",
                       "!propertySymOpnd->IsRootObjectNonConfigurableFieldLoad()");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pPVar7 = Sym::AsPropertySym((this_01->super_SymOpnd).m_sym);
  uVar1 = this_01->m_inlineCacheIndex;
  sourceContextId = Func::GetSourceContextId(this->m_func);
  functionId = Func::GetLocalFunctionId(this->m_func);
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,ObjTypeSpecPhase,sourceContextId,functionId)
  ;
  if (bVar4) {
    pcVar8 = Js::OpCodeUtil::GetOpCodeName(instrChkObjType->m_opcode);
    uVar2 = pPVar7->m_propertyId;
    this_02 = Func::GetJITFunctionBody(this->m_func);
    pcVar9 = JITTimeFunctionBody::GetDisplayName(this_02);
    pcVar10 = IR::PropertySymOpnd::GetCacheLayoutString(this_01);
    Output::Print(L"Object type check: %s, property ID: %d, func: %s, cache ID: %d, cloned cache: true, layout: %s, redundant check: %s\n"
                  ,pcVar8,(ulong)uVar2,pcVar9,(ulong)uVar1,pcVar10,L"false");
    Output::Flush();
  }
  labelObjCheckFailed = IR::LabelInstr::New(Label,this->m_func,true);
  GenerateCachedTypeCheck
            (this,instrChkObjType,this_01,labelObjCheckFailed,labelObjCheckFailed,(LabelInstr *)0x0)
  ;
  branchTarget = IR::LabelInstr::New(Label,this->m_func,false);
  instr_00 = IR::BranchInstr::New(JMP,branchTarget,this->m_func);
  IR::Instr::InsertBefore(instrChkObjType,&instr_00->super_Instr);
  IR::Instr::InsertBefore(instrChkObjType,&labelObjCheckFailed->super_Instr);
  IR::Instr::InsertAfter(instrChkObjType,&branchTarget->super_Instr);
  bVar4 = IR::PropertySymOpnd::ProducesAuxSlotPtr(this_01);
  if (bVar4) {
    GenerateAuxSlotPtrLoad(this,this_01,(branchTarget->super_Instr).m_next);
  }
  bVar4 = IR::Instr::HasBailOutInfo(instrChkObjType);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1943,"(instrChkObjType->HasBailOutInfo())",
                       "instrChkObjType->HasBailOutInfo()");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pBVar11 = IR::Instr::GetBailOutInfo(instrChkObjType);
  if (pBVar11->bailOutInstr != instrChkObjType) {
    pBVar11 = IR::Instr::GetBailOutInfo(instrChkObjType);
    pBVar11->polymorphicCacheIndex = uVar1;
  }
  IR::Instr::FreeSrc1(instrChkObjType);
  instrChkObjType->m_opcode = BailOut;
  GenerateBailOut(this,instrChkObjType,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
  return;
}

Assistant:

void
Lowerer::GenerateCheckObjType(IR::Instr * instrChkObjType)
{
    Assert(instrChkObjType->GetSrc1()->IsSymOpnd() && instrChkObjType->GetSrc1()->AsSymOpnd()->IsPropertySymOpnd());
    IR::PropertySymOpnd *propertySymOpnd = instrChkObjType->GetSrc1()->AsPropertySymOpnd();

    // Why do we have an explicit type check if the cached type has been checked upstream?  The dead store pass should have
    // removed this instruction.
    Assert(propertySymOpnd->IsTypeCheckSeqCandidate() && !propertySymOpnd->IsTypeChecked());
    // Why do we have an explicit type check on a non-configurable root field load?
    Assert(!propertySymOpnd->IsRootObjectNonConfigurableFieldLoad());

    PropertySym * propertySym = propertySymOpnd->m_sym->AsPropertySym();
    uint inlineCacheIndex = propertySymOpnd->m_inlineCacheIndex;

    PHASE_PRINT_TESTTRACE(
        Js::ObjTypeSpecPhase,
        this->m_func,
        _u("Object type check: %s, property ID: %d, func: %s, cache ID: %d, cloned cache: true, layout: %s, redundant check: %s\n"),
        Js::OpCodeUtil::GetOpCodeName(instrChkObjType->m_opcode),
        propertySym->m_propertyId,
        this->m_func->GetJITFunctionBody()->GetDisplayName(),
        inlineCacheIndex, propertySymOpnd->GetCacheLayoutString(), _u("false"));

    IR::LabelInstr* labelBailOut = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);

    this->GenerateCachedTypeCheck(instrChkObjType, propertySymOpnd, labelBailOut, labelBailOut);
    IR::LabelInstr* labelDone = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
    IR::Instr* instr = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelDone, this->m_func);
    instrChkObjType->InsertBefore(instr);

    // Insert the bailout label here.
    instrChkObjType->InsertBefore(labelBailOut);
    instrChkObjType->InsertAfter(labelDone);

    if (propertySymOpnd->ProducesAuxSlotPtr())
    {
        this->GenerateAuxSlotPtrLoad(propertySymOpnd, labelDone->m_next);
    }

    // Convert the original instruction to a bailout.
    Assert(instrChkObjType->HasBailOutInfo());

    if (instrChkObjType->GetBailOutInfo()->bailOutInstr != instrChkObjType)
    {
        // Set the cache index in the bailout info so that the bailout code will write it into the
        // bailout record at runtime.
        instrChkObjType->GetBailOutInfo()->polymorphicCacheIndex = inlineCacheIndex;
    }

    instrChkObjType->FreeSrc1();
    instrChkObjType->m_opcode = Js::OpCode::BailOut;
    this->GenerateBailOut(instrChkObjType);
}